

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_suba_16_pcix(void)

{
  uint uVar1;
  uint uVar2;
  uint src;
  uint *r_dst;
  
  uVar1 = m68ki_cpu.ir >> 9;
  uVar2 = OPER_PCIX_16();
  m68ki_cpu.dar[(ulong)(uVar1 & 7) + 8] = m68ki_cpu.dar[(ulong)(uVar1 & 7) + 8] - (int)(short)uVar2;
  return;
}

Assistant:

static void m68k_op_suba_16_pcix(void)
{
	uint* r_dst = &AX;
	uint src = MAKE_INT_16(OPER_PCIX_16());

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}